

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
                  *this,list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  pointer pbVar2;
  bool bVar3;
  MatchResultListener *pMVar4;
  pointer pMVar5;
  _List_node_base *p_Var6;
  pointer pMVar7;
  _func_int **pp_Var8;
  bool bVar9;
  size_t count;
  size_t local_210;
  ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
  *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  StringMatchResultListener s;
  string local_50 [32];
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  p_Var6 = (container->values_).
           super__List_base<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_208 = this;
  for (count = 0;
      (local_210 = count, p_Var6 != (_List_node_base *)&container->values_ &&
      (pMVar5 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      count != ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5) / 0x18));
      count = count + 1) {
    if (poVar1 == (ostream *)0x0) {
      s.super_MatchResultListener.stream_ = (ostream *)0x0;
      s.super_MatchResultListener._vptr_MatchResultListener =
           (_func_int **)&PTR__MatchResultListener_00199590;
      bVar3 = MatcherBase<const_(anonymous_namespace)::enumeration_&>::MatchAndExplain
                        (&pMVar5[count].
                          super_MatcherBase<const_(anonymous_namespace)::enumeration_&>,
                         (enumeration *)(p_Var6 + 1),&s.super_MatchResultListener);
      count = local_210;
      if (!bVar3) {
        bVar3 = true;
        goto LAB_00124523;
      }
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      bVar3 = MatcherBase<const_(anonymous_namespace)::enumeration_&>::MatchAndExplain
                        (&(this->matchers_).
                          super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[count].
                          super_MatcherBase<const_(anonymous_namespace)::enumeration_&>,
                         (enumeration *)(p_Var6 + 1),&s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      count = local_210;
      std::__cxx11::string::operator=
                ((string *)
                 (explanations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_210),local_50);
      std::__cxx11::string::~string(local_50);
      StringMatchResultListener::~StringMatchResultListener(&s);
      this = local_208;
      if (!bVar3) {
        bVar3 = true;
        goto LAB_00124523;
      }
    }
    p_Var6 = p_Var6->_M_next;
  }
  bVar3 = false;
LAB_00124523:
  for (; p_Var6 != (_List_node_base *)&container->values_; p_Var6 = p_Var6->_M_next) {
    count = count + 1;
  }
  pMVar5 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar7 - (long)pMVar5) / 0x18 == count) {
    if (!bVar3) {
      bVar3 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar9 = false;
        pp_Var8 = (_func_int **)0x0;
        while (pbVar2 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var8,
              pp_Var8 != (_func_int **)(((long)pMVar7 - (long)pMVar5) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var8]._M_string_length != 0) {
            if (bVar9) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar4 = MatchResultListener::operator<<(pMVar4,(unsigned_long *)&s);
            pMVar4 = MatchResultListener::operator<<(pMVar4,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar4,pbVar2 + (long)pp_Var8);
            pMVar5 = (local_208->matchers_).
                     super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar7 = (local_208->matchers_).
                     super__Vector_base<testing::Matcher<const_(anonymous_namespace)::enumeration_&>,_std::allocator<testing::Matcher<const_(anonymous_namespace)::enumeration_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar9 = true;
          }
          pp_Var8 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
      }
      goto LAB_001245f3;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar4 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar4 = MatchResultListener::operator<<(pMVar4,&local_210);
      MatchResultListener::operator<<(pMVar4,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_210,listener->stream_);
    }
  }
  else {
    bVar3 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_001245f3;
    pMVar4 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_pstore::command_line::list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>_&>
              *)&s,count);
    MatchResultListener::operator<<(pMVar4,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar3 = false;
LAB_001245f3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar3;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }